

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O1

bool tinyusdz::LoadMaterialXFromAsset
               (Asset *asset,string *asset_path,PrimSpec *ps,string *warn,string *err)

{
  pointer puVar1;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  char *pcVar7;
  string str;
  MtlxModel mtlx;
  ostringstream ss_e;
  long *local_340;
  long local_330 [2];
  string local_320;
  MtlxModel local_300;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  puVar1 = (asset->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (long)(asset->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  if (uVar4 < 0x20) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
    return false;
  }
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,puVar1,puVar1 + uVar4);
  local_300.asset_name._M_dataplus._M_p = (pointer)&local_300.asset_name.field_2;
  local_300.asset_name._M_string_length = 0;
  local_300.asset_name.field_2._M_local_buf[0] = '\0';
  local_300.version._M_dataplus._M_p = (pointer)&local_300.version.field_2;
  local_300.version._M_string_length = 0;
  local_300.version.field_2._M_local_buf[0] = '\0';
  local_300.cms._M_dataplus._M_p = (pointer)&local_300.cms.field_2;
  local_300.cms._M_string_length = 0;
  local_300.cms.field_2._M_local_buf[0] = '\0';
  local_300.cmsconfig._M_dataplus._M_p = (pointer)&local_300.cmsconfig.field_2;
  local_300.cmsconfig._M_string_length = 0;
  local_300.cmsconfig.field_2._M_local_buf[0] = '\0';
  local_300.color_space._M_dataplus._M_p = (pointer)&local_300.color_space.field_2;
  local_300.color_space._M_string_length = 0;
  local_300.color_space.field_2._M_local_buf[0] = '\0';
  local_300.name_space._M_dataplus._M_p = (pointer)&local_300.name_space.field_2;
  local_300.name_space._M_string_length = 0;
  local_300.name_space.field_2._M_local_buf[0] = '\0';
  local_300.shader_name._M_dataplus._M_p = (pointer)&local_300.shader_name.field_2;
  local_300.shader_name._M_string_length = 0;
  local_300.shader_name.field_2._M_local_buf[0] = '\0';
  local_300.shader.v_.vtable =
       (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_300.shader.v_.storage.dynamic = (void *)0x0;
  local_300.surface_materials._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_300.surface_materials._M_t._M_impl.super__Rb_tree_header._M_header;
  local_300.surface_materials._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_300.surface_materials._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_300.surface_materials._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_300.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_300.shaders._M_t._M_impl.super__Rb_tree_header._M_header;
  local_300.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_300.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_300.shaders._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_300.surface_materials._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_300.surface_materials._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_300.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_300.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar2 = ReadMaterialXFromString(&local_320,asset_path,&local_300,warn,err);
  if (bVar2) {
    bVar2 = ToPrimSpec(&local_300,ps,err);
    bVar6 = true;
    if (bVar2) goto LAB_002e1e56;
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc",
               0x51);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"LoadMaterialXFromAsset",0x16);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x3f0);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    pcVar7 = "Failed to convert MaterialX to USD PrimSpec.";
    lVar5 = 0x2c;
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc",
               0x51);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"LoadMaterialXFromAsset",0x16);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x3ec);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    pcVar7 = "Failed to read MaterialX.";
    lVar5 = 0x19;
  }
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,lVar5);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  if (err != (string *)0x0) {
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)err,(ulong)local_340);
    if (local_340 != local_330) {
      operator_delete(local_340,local_330[0] + 1);
    }
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  ::std::ios_base::~ios_base(local_138);
  bVar6 = false;
LAB_002e1e56:
  MtlxModel::~MtlxModel(&local_300);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  return bVar6;
}

Assistant:

bool LoadMaterialXFromAsset(const Asset &asset, const std::string &asset_path,
                            PrimSpec &ps /* inout */, std::string *warn,
                            std::string *err) {
  (void)asset_path;
  (void)warn;

  if (asset.size() < 32) {
    if (err) {
      (*err) += "MateiralX: Asset size too small.\n";
    }
    return false;
  }

  std::string str(reinterpret_cast<const char *>(asset.data()), asset.size());

  MtlxModel mtlx;
  if (!ReadMaterialXFromString(str, asset_path, &mtlx, warn, err)) {
    PUSH_ERROR_AND_RETURN("Failed to read MaterialX.");
  }

  if (!ToPrimSpec(mtlx, ps, err)) {
    PUSH_ERROR_AND_RETURN("Failed to convert MaterialX to USD PrimSpec.");
  }

  return true;
}